

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_create(PRNGState *rs)

{
  void *pvVar1;
  mchunkptr p;
  ulong local_58;
  mstate m;
  mchunkptr msp;
  mchunkptr mn;
  size_t msize;
  char *tbase;
  size_t tsize;
  PRNGState *rs_local;
  
  pvVar1 = mmap_probe(rs,0x20000);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    rs_local = (PRNGState *)0x0;
  }
  else {
    if (((long)pvVar1 + 0x10U & 7) == 0) {
      local_58 = 0;
    }
    else {
      local_58 = 8 - ((long)pvVar1 + 0x10U & 7) & 7;
    }
    rs_local = (PRNGState *)((long)pvVar1 + local_58 + 0x10);
    memset(rs_local,0,0x370);
    *(undefined8 *)((long)pvVar1 + local_58 + 8) = 0x373;
    *(void **)((long)pvVar1 + local_58 + 0x358) = pvVar1;
    *(undefined8 *)((long)pvVar1 + local_58 + 0x360) = 0x20000;
    *(undefined8 *)((long)pvVar1 + local_58 + 0x40) = 0xff;
    init_bins((mstate)rs_local);
    p = (mchunkptr)
        ((long)pvVar1 + (*(ulong *)((long)pvVar1 + local_58 + 8) & 0xfffffffffffffffc) + local_58);
    init_top((mstate)rs_local,p,(long)pvVar1 + (0x1ffc0 - (long)p));
  }
  return rs_local;
}

Assistant:

void *lj_alloc_create(PRNGState *rs)
{
  size_t tsize = DEFAULT_GRANULARITY;
  char *tbase;
  INIT_MMAP();
  UNUSED(rs);
  tbase = (char *)(CALL_MMAP(rs, tsize));
  if (tbase != CMFAIL) {
    size_t msize = pad_request(sizeof(struct malloc_state));
    mchunkptr mn;
    mchunkptr msp = align_as_chunk(tbase);
    mstate m = (mstate)(chunk2mem(msp));
    memset(m, 0, msize);
    msp->head = (msize|PINUSE_BIT|CINUSE_BIT);
    m->seg.base = tbase;
    m->seg.size = tsize;
    m->release_checks = MAX_RELEASE_CHECK_RATE;
    init_bins(m);
    mn = next_chunk(mem2chunk(m));
    init_top(m, mn, (size_t)((tbase + tsize) - (char *)mn) - TOP_FOOT_SIZE);
    return m;
  }
  return NULL;
}